

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  Version *this_00;
  bool bVar1;
  int level;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  Env *local_38;
  
  local_38 = *(Env **)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->mutex_).mu_);
  this_00 = this->versions_->current_;
  iVar3 = 1;
  for (iVar2 = 1; iVar2 != 7; iVar2 = iVar2 + 1) {
    bVar1 = Version::OverlapInLevel(this_00,iVar2,begin,end);
    if (bVar1) {
      iVar3 = iVar2;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffc0);
  Status::~Status((Status *)&stack0xffffffffffffffc0);
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    TEST_CompactRange(this,iVar2,begin,end);
  }
  if (*(Env **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}